

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::ConvolutionLayer2D<3UL>::ConvolutionLayer2D
          (ConvolutionLayer2D<3UL> *this,size_t imageWidth,size_t imageHeight,Array *weights,
          Array *bias)

{
  uint in_EAX;
  valarray<float> *pvVar1;
  undefined8 uStack_38;
  
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__001b16c8;
  this->inputWidth = imageWidth;
  this->inputHeight = imageHeight;
  this->inputSize = imageHeight * imageWidth;
  this->outputWidth = imageWidth - 2;
  this->outputHeight = imageHeight - 2;
  this->outputSize = (imageHeight - 2) * (imageWidth - 2);
  uStack_38._0_4_ = in_EAX;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,weights);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->weights,pvVar1)
  ;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,bias);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->bias,pvVar1);
  uStack_38 = (ulong)(uint)uStack_38;
  std::valarray<float>::valarray(&this->localGrad,(float *)((long)&uStack_38 + 4),this->outputSize);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  uStack_38 = uStack_38 & 0xffffffff;
  std::valarray<float>::valarray(pvVar1,(float *)((long)&uStack_38 + 4),9);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)
             &this->weightSensitivity,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  uStack_38 = uStack_38 & 0xffffffff;
  std::valarray<float>::valarray(pvVar1,(float *)((long)&uStack_38 + 4),1);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->biasSensitivity
             ,pvVar1);
  uStack_38 = uStack_38 & 0xffffffff;
  std::valarray<float>::valarray
            (&this->propagatedErrors,(float *)((long)&uStack_38 + 4),this->inputSize);
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (weights->_M_size !=
      ((this->weightSensitivity).
       super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_size) {
    __assert_fail("weights.size() == weightSensitivity->size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x6cb,
                  "notch::ConvolutionLayer2D<>::ConvolutionLayer2D(size_t, size_t, const Array &, const Array &) [kernelSize = 3]"
                 );
  }
  if (bias->_M_size ==
      ((this->biasSensitivity).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_M_size) {
    return;
  }
  __assert_fail("bias.size() == biasSensitivity->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x6cc,
                "notch::ConvolutionLayer2D<>::ConvolutionLayer2D(size_t, size_t, const Array &, const Array &) [kernelSize = 3]"
               );
}

Assistant:

ConvolutionLayer2D(size_t imageWidth, size_t imageHeight,
                       const Array &weights, const Array &bias)
        : inputWidth(imageWidth), inputHeight(imageHeight),
          inputSize(inputWidth * inputHeight),
          outputWidth(imageWidth - kernelSize + 1),
          outputHeight(imageHeight - kernelSize + 1),
          outputSize(outputWidth * outputHeight),
          weights(new Array(weights)),
          bias(new Array(bias)),
          localGrad(0.0, outputSize),
          weightSensitivity(new Array(0.0, kernelSize*kernelSize)),
          biasSensitivity(new Array(0.0, 1)),
          propagatedErrors(0.0, inputSize) {
              assert(weights.size() == weightSensitivity->size());
              assert(bias.size() == biasSensitivity->size());
          }